

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_promise_race(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSRuntime *pJVar1;
  JSValue new_target;
  JSValue func_obj;
  int iVar2;
  JSValueUnion JVar4;
  ulong uVar5;
  undefined4 in_register_0000000c;
  JSValue this_val_00;
  JSValue v;
  JSValue v_00;
  JSValue JVar6;
  JSValue JVar7;
  JSValue method;
  JSValue JVar8;
  BOOL done;
  JSValue resolving_funcs [2];
  JSValue error;
  undefined4 uVar9;
  uint in_stack_ffffffffffffff0c;
  BOOL *in_stack_ffffffffffffff10;
  JSValueUnion local_d0;
  JSValueUnion local_b8;
  JSValueUnion local_b0;
  uint local_98;
  int local_8c;
  JSValueUnion local_88 [2];
  JSValueUnion local_78;
  int64_t local_70;
  JSValueUnion local_68;
  int64_t local_60;
  JSValueUnion local_58;
  JSValueUnion local_50;
  JSValueUnion local_48;
  int64_t iStack_40;
  JSValueUnion JVar3;
  
  if ((int)this_val.tag == -1) {
    v_00 = js_new_promise_capability(ctx,(JSValue *)&local_78,this_val);
    JVar3 = v_00.u;
    if ((uint)v_00.tag != 6) {
      local_50 = JVar3;
      JVar6 = JS_GetPropertyInternal(ctx,this_val,0x80,this_val,0);
      if ((uint)JVar6.tag == 6) {
        JVar7 = (JSValue)(ZEXT816(3) << 0x40);
        method = (JSValue)(ZEXT816(3) << 0x40);
      }
      else {
        iVar2 = check_function(ctx,JVar6);
        if (iVar2 == 0) {
          method = (JSValue)(ZEXT816(3) << 0x40);
          JVar7 = JS_GetIterator(ctx,*argv,0);
          if ((int)JVar7.tag != 6) {
            uVar9 = 0;
            method = JS_GetPropertyInternal(ctx,JVar7,0x6a,JVar7,0);
            if ((int)method.tag != 6) {
              do {
                local_88 = (JSValueUnion  [2])
                           JS_IteratorNext(ctx,JVar7,method,(int)&local_8c,
                                           (JSValue *)CONCAT44(in_stack_ffffffffffffff0c,uVar9),
                                           in_stack_ffffffffffffff10);
                if (local_88[1]._0_4_ == 6) goto LAB_0014b4b5;
                if (local_8c != 0) goto LAB_0014b5e8;
                uVar9 = 0;
                in_stack_ffffffffffffff0c = local_d0._4_4_;
                in_stack_ffffffffffffff10 = (BOOL *)0x3;
                JVar8.tag = 3;
                JVar8.u.ptr = (void *)((ulong)in_stack_ffffffffffffff0c << 0x20);
                JVar8 = JS_CallInternal(ctx,JVar6,this_val,JVar8,1,(JSValue *)local_88,2);
                this_val_00.tag = JVar8.tag;
                JVar4 = JVar8.u;
                local_d0.float64 = local_88[0].float64;
                if ((0xfffffff4 < local_88[1]._0_4_) &&
                   (iVar2 = *local_88[0].ptr, *(int *)local_88[0].ptr = iVar2 + -1, iVar2 < 2)) {
                  local_58 = JVar4;
                  __JS_FreeValueRT(ctx->rt,(JSValue)local_88);
                  JVar4 = local_58;
                }
                if ((int)JVar8.tag == 6) break;
                this_val_00.u.float64 = JVar4.float64;
                JVar8 = JS_InvokeFree(ctx,this_val_00,0x7f,2,(JSValue *)&local_78);
                iVar2 = check_exception_free(ctx,JVar8);
              } while (iVar2 == 0);
              JS_IteratorClose(ctx,JVar7,1);
            }
          }
        }
        else {
          JVar7 = (JSValue)(ZEXT816(3) << 0x40);
          method = (JSValue)(ZEXT816(3) << 0x40);
        }
      }
LAB_0014b4b5:
      pJVar1 = ctx->rt;
      local_48 = (JSValueUnion)(pJVar1->current_exception).u.ptr;
      iStack_40 = (pJVar1->current_exception).tag;
      (pJVar1->current_exception).u.int32 = 0;
      (pJVar1->current_exception).tag = 2;
      func_obj.tag = local_60;
      func_obj.u.float64 = local_68.float64;
      new_target.tag = 3;
      new_target.u.float64 = local_d0.float64 & 0xffffffff00000000;
      JVar8 = JS_CallInternal(ctx,func_obj,(JSValue)(ZEXT816(3) << 0x40),new_target,1,
                              (JSValue *)&local_48,2);
      if ((0xfffffff4 < (uint)iStack_40) &&
         (iVar2 = *local_48.ptr, *(int *)local_48.ptr = iVar2 + -1, iVar2 < 2)) {
        v.tag = iStack_40;
        v.u.ptr = local_48.ptr;
        __JS_FreeValueRT(ctx->rt,v);
      }
      if ((uint)JVar8.tag == 6) {
        if ((0xfffffff4 < (uint)v_00.tag) &&
           (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
          __JS_FreeValueRT(ctx->rt,v_00);
        }
        v_00 = (JSValue)(ZEXT816(6) << 0x40);
      }
      else if ((0xfffffff4 < (uint)JVar8.tag) &&
              (iVar2 = *JVar8.u.ptr, *(int *)JVar8.u.ptr = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar8);
      }
LAB_0014b5e8:
      local_b0 = method.u;
      local_b8 = JVar7.u;
      if ((0xfffffff4 < (uint)JVar6.tag) &&
         (iVar2 = *JVar6.u.ptr, *(int *)JVar6.u.ptr = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar6);
      }
      local_98 = (uint)method.tag;
      if ((0xfffffff4 < local_98) &&
         (iVar2 = *local_b0.ptr, *(int *)local_b0.ptr = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(ctx->rt,method);
      }
      if ((0xfffffff4 < (uint)JVar7.tag) &&
         (iVar2 = *local_b8.ptr, *(int *)local_b8.ptr = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar7);
      }
      if ((0xfffffff4 < (uint)local_70) &&
         (iVar2 = *local_78.ptr, *(int *)local_78.ptr = iVar2 + -1, iVar2 < 2)) {
        JVar6.tag = local_70;
        JVar6.u.ptr = local_78.ptr;
        __JS_FreeValueRT(ctx->rt,JVar6);
      }
      uVar5 = (ulong)local_50.ptr & 0xffffffff00000000;
      if ((0xfffffff4 < (uint)local_60) &&
         (iVar2 = *local_68.ptr, *(int *)local_68.ptr = iVar2 + -1, iVar2 < 2)) {
        JVar7.tag = local_60;
        JVar7.u.ptr = local_68.ptr;
        __JS_FreeValueRT(ctx->rt,JVar7);
      }
      v_00.tag = v_00.tag;
      v_00.u.ptr = (void *)((ulong)v_00.u.ptr & 0xffffffff | uVar5);
    }
  }
  else {
    JS_ThrowTypeError(ctx,"not an object",this_val.tag,CONCAT44(in_register_0000000c,argc));
    v_00 = (JSValue)(ZEXT816(6) << 0x40);
  }
  return v_00;
}

Assistant:

static JSValue js_promise_race(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    JSValue result_promise, resolving_funcs[2], item, next_promise, ret;
    JSValue next_method = JS_UNDEFINED, iter = JS_UNDEFINED;
    JSValue promise_resolve = JS_UNDEFINED;
    BOOL done;

    if (!JS_IsObject(this_val))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    result_promise = js_new_promise_capability(ctx, resolving_funcs, this_val);
    if (JS_IsException(result_promise))
        return result_promise;
    promise_resolve = JS_GetProperty(ctx, this_val, JS_ATOM_resolve);
    if (JS_IsException(promise_resolve) ||
        check_function(ctx, promise_resolve))
        goto fail_reject;
    iter = JS_GetIterator(ctx, argv[0], FALSE);
    if (JS_IsException(iter)) {
        JSValue error;
    fail_reject:
        error = JS_GetException(ctx);
        ret = JS_Call(ctx, resolving_funcs[1], JS_UNDEFINED, 1,
                       (JSValueConst *)&error);
        JS_FreeValue(ctx, error);
        if (JS_IsException(ret))
            goto fail;
        JS_FreeValue(ctx, ret);
    } else {
        next_method = JS_GetProperty(ctx, iter, JS_ATOM_next);
        if (JS_IsException(next_method))
            goto fail_reject;

        for(;;) {
            /* XXX: conformance: should close the iterator if error on 'done'
               access, but not on 'value' access */
            item = JS_IteratorNext(ctx, iter, next_method, 0, NULL, &done);
            if (JS_IsException(item))
                goto fail_reject;
            if (done)
                break;
            next_promise = JS_Call(ctx, promise_resolve,
                                   this_val, 1, (JSValueConst *)&item);
            JS_FreeValue(ctx, item);
            if (JS_IsException(next_promise)) {
            fail_reject1:
                JS_IteratorClose(ctx, iter, TRUE);
                goto fail_reject;
            }
            ret = JS_InvokeFree(ctx, next_promise, JS_ATOM_then, 2,
                                (JSValueConst *)resolving_funcs);
            if (check_exception_free(ctx, ret))
                goto fail_reject1;
        }
    }
 done:
    JS_FreeValue(ctx, promise_resolve);
    JS_FreeValue(ctx, next_method);
    JS_FreeValue(ctx, iter);
    JS_FreeValue(ctx, resolving_funcs[0]);
    JS_FreeValue(ctx, resolving_funcs[1]);
    return result_promise;
 fail:
    //JS_FreeValue(ctx, next_method); // why not???
    JS_FreeValue(ctx, result_promise);
    result_promise = JS_EXCEPTION;
    goto done;
}